

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O0

int mg_session_write_map(mg_session *session,mg_map *map)

{
  int iVar1;
  mg_session *in_RSI;
  undefined8 in_RDI;
  int status_2;
  int status_1;
  uint32_t i;
  int status;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint uVar2;
  uint32_t len;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mg_session_write_container_size
                    ((mg_session *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (uint32_t)((ulong)in_RDI >> 0x20),(uint8_t *)in_RSI);
  if (iVar1 == 0) {
    len = 0;
    for (uVar2 = 0; uVar2 < (uint)in_RSI->status; uVar2 = uVar2 + 1) {
      in_stack_ffffffffffffffdc =
           mg_session_write_string2
                     (in_RSI,len,
                      (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (in_stack_ffffffffffffffdc != 0) {
        return in_stack_ffffffffffffffdc;
      }
      iVar1 = mg_session_write_value(in_RSI,(mg_value *)CONCAT44(len,uVar2));
      if (iVar1 != 0) {
        return iVar1;
      }
      in_stack_ffffffffffffffd8 = 0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mg_session_write_map(mg_session *session, const mg_map *map) {
  MG_RETURN_IF_FAILED(
      mg_session_write_container_size(session, map->size, MG_MARKERS_MAP));
  for (uint32_t i = 0; i < map->size; ++i) {
    MG_RETURN_IF_FAILED(mg_session_write_string2(session, map->keys[i]->size,
                                                 map->keys[i]->data));
    MG_RETURN_IF_FAILED(mg_session_write_value(session, map->values[i]));
  }
  return 0;
}